

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_object_getOwnPropertyDescriptors(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  JSRefCountHeader *p;
  ulong uVar5;
  JSValueUnion JVar6;
  JSRefCountHeader *p_2;
  ulong uVar7;
  JSValue JVar8;
  JSValue JVar9;
  JSValue v;
  JSValue JVar10;
  uint32_t len;
  JSPropertyEnum *props;
  uint32_t local_8c;
  JSValueUnion local_88;
  int64_t local_80;
  JSValueUnion local_78;
  int64_t local_70;
  JSPropertyEnum *local_68;
  ulong local_60;
  JSValueUnion local_58;
  int64_t local_50;
  JSValue local_48;
  
  JVar8 = JS_ToObject(ctx,*argv);
  if ((int)JVar8.tag != 6) {
    iVar3 = JS_GetOwnPropertyNamesInternal(ctx,&local_68,&local_8c,(JSObject *)JVar8.u.ptr,3);
    if (iVar3 == 0) {
      uVar4 = 1;
      JVar9 = JS_NewObjectProtoClass(ctx,ctx->class_proto[1],1);
      uVar5 = (ulong)JVar9.u.ptr >> 0x20;
      if ((int)JVar9.tag != 6) {
        _local_78 = JVar8;
        local_60 = uVar5;
        if (local_8c != 0) {
          uVar7 = 0;
          do {
            JVar6._4_4_ = 0;
            JVar6.int32 = local_68[uVar7].atom;
            _local_88 = JVar9;
            v = __JS_AtomToValue(ctx,local_68[uVar7].atom,0);
            JVar10.tag = v.tag;
            uVar5 = local_60;
            JVar9 = _local_88;
            JVar8 = _local_78;
            if ((uint)v.tag == 6) goto LAB_0015f2fe;
            local_58 = local_78;
            local_50 = local_70;
            JVar10.u.float64 = JVar6.float64;
            local_48 = v;
            JVar10 = js_object_getOwnPropertyDescriptor
                               (ctx,JVar10,(int)uVar4,(JSValue *)&local_58,0);
            if (0xfffffff4 < (uint)v.tag) {
              uVar2 = *v.u.ptr;
              uVar1 = uVar2 - 1;
              uVar4 = (ulong)uVar1;
              *(uint *)v.u.ptr = uVar1;
              if ((int)uVar2 < 2) {
                __JS_FreeValueRT(ctx->rt,v);
              }
            }
            JVar9 = _local_88;
            if ((int)JVar10.tag != 3) {
              uVar5 = local_60;
              JVar8 = _local_78;
              if ((int)JVar10.tag == 6) goto LAB_0015f2fe;
              uVar4 = (ulong)local_68[uVar7].atom;
              iVar3 = JS_DefinePropertyValue(ctx,_local_88,local_68[uVar7].atom,JVar10,0x4007);
              uVar5 = local_60;
              JVar9 = _local_88;
              JVar8 = _local_78;
              if (iVar3 < 0) goto LAB_0015f2fe;
            }
            uVar7 = uVar7 + 1;
          } while (local_8c != uVar7);
        }
        _local_88 = JVar9;
        js_free_prop_enum(ctx,local_68,local_8c);
        if ((0xfffffff4 < local_78._8_4_) &&
           (iVar3 = *local_78.ptr, *(int *)local_78.ptr = iVar3 + -1, iVar3 < 2)) {
          __JS_FreeValueRT(ctx->rt,_local_78);
        }
        uVar4 = (ulong)local_88.ptr & 0xffffffff00000000;
        uVar5 = (ulong)local_88.ptr & 0xffffffff;
        goto LAB_0015f35c;
      }
    }
    else {
      uVar5 = 0;
      JVar9 = (JSValue)(ZEXT816(3) << 0x40);
    }
LAB_0015f2fe:
    js_free_prop_enum(ctx,local_68,local_8c);
    if ((0xfffffff4 < (uint)JVar8.tag) &&
       (iVar3 = *JVar8.u.ptr, *(int *)JVar8.u.ptr = iVar3 + -1, iVar3 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar8);
    }
    if (0xfffffff4 < (uint)JVar9.tag) {
      JVar8.u.ptr = (void *)((ulong)JVar9.u.ptr & 0xffffffff | uVar5 << 0x20);
      iVar3 = *JVar8.u.ptr;
      *(int *)JVar8.u.ptr = iVar3 + -1;
      if (iVar3 < 2) {
        JVar8.tag = JVar9.tag;
        __JS_FreeValueRT(ctx->rt,JVar8);
      }
    }
  }
  uVar5 = 0;
  uVar4 = 0;
  local_80 = 6;
LAB_0015f35c:
  JVar9.u.ptr = (void *)(uVar5 | uVar4);
  JVar9.tag = local_80;
  return JVar9;
}

Assistant:

static JSValue js_object_getOwnPropertyDescriptors(JSContext *ctx, JSValueConst this_val,
                                                   int argc, JSValueConst *argv)
{
    //getOwnPropertyDescriptors(obj)
    JSValue obj, r;
    JSObject *p;
    JSPropertyEnum *props;
    uint32_t len, i;

    r = JS_UNDEFINED;
    obj = JS_ToObject(ctx, argv[0]);
    if (JS_IsException(obj))
        return JS_EXCEPTION;

    p = JS_VALUE_GET_OBJ(obj);
    if (JS_GetOwnPropertyNamesInternal(ctx, &props, &len, p,
                               JS_GPN_STRING_MASK | JS_GPN_SYMBOL_MASK))
        goto exception;
    r = JS_NewObject(ctx);
    if (JS_IsException(r))
        goto exception;
    for(i = 0; i < len; i++) {
        JSValue atomValue, desc;
        JSValueConst args[2];

        atomValue = JS_AtomToValue(ctx, props[i].atom);
        if (JS_IsException(atomValue))
            goto exception;
        args[0] = obj;
        args[1] = atomValue;
        desc = js_object_getOwnPropertyDescriptor(ctx, JS_UNDEFINED, 2, args, 0);
        JS_FreeValue(ctx, atomValue);
        if (JS_IsException(desc))
            goto exception;
        if (!JS_IsUndefined(desc)) {
            if (JS_DefinePropertyValue(ctx, r, props[i].atom, desc,
                                       JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                goto exception;
        }
    }
    js_free_prop_enum(ctx, props, len);
    JS_FreeValue(ctx, obj);
    return r;

exception:
    js_free_prop_enum(ctx, props, len);
    JS_FreeValue(ctx, obj);
    JS_FreeValue(ctx, r);
    return JS_EXCEPTION;
}